

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

StringUtil * __thiscall
cfd::core::StringUtil::ByteToString_abi_cxx11_
          (StringUtil *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  bool bVar1;
  uchar *puVar2;
  size_type sVar3;
  CfdException *this_00;
  char *wally_string;
  allocator local_b1;
  string local_b0;
  CfdSourceLocation local_90;
  string local_78;
  int local_54;
  WallyUtil *pWStack_50;
  int ret;
  char *buffer;
  CfdSourceLocation local_38;
  undefined1 local_19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes_local;
  string *byte_str;
  
  local_19 = 0;
  local_18 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)bytes;
  bytes_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  ::std::__cxx11::string::string((string *)this);
  bVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(local_18);
  if (bVar1) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0x4e1;
    local_38.funcname = "ByteToString";
    logger::info<>(&local_38,"bytes empty. return empty string.");
  }
  else {
    pWStack_50 = (WallyUtil *)0x0;
    puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_18);
    sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
    local_54 = wally_hex_from_bytes(puVar2,sVar3,&stack0xffffffffffffffb0);
    if (local_54 != 0) {
      local_90.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_util.cpp"
                   ,0x2f);
      local_90.filename = local_90.filename + 1;
      local_90.line = 0x4e8;
      local_90.funcname = "ByteToString";
      logger::warn<int&>(&local_90,"wally_hex_from_bytes NG[{}].",&local_54);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_b0,"byte to hex convert error.",&local_b1);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_b0);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    WallyUtil::ConvertStringAndFree_abi_cxx11_(&local_78,pWStack_50,wally_string);
    ::std::__cxx11::string::operator=((string *)this,(string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_78);
  }
  return this;
}

Assistant:

std::string StringUtil::ByteToString(const std::vector<uint8_t> &bytes) {
  std::string byte_str;
  if (bytes.empty()) {
    info(CFD_LOG_SOURCE, "bytes empty. return empty string.");
  } else {
    char *buffer = NULL;
    int ret = wally_hex_from_bytes(bytes.data(), bytes.size(), &buffer);
    if (ret == WALLY_OK) {
      byte_str = WallyUtil::ConvertStringAndFree(buffer);
    } else {
      warn(CFD_LOG_SOURCE, "wally_hex_from_bytes NG[{}].", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "byte to hex convert error.");
    }
  }
  return byte_str;
}